

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.h
# Opt level: O1

void __thiscall phyr::MemoryPool::stash(MemoryPool *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var1 = *(_List_node_base **)(this + 0x20);
  if (p_Var1 != (_List_node_base *)0x0) {
    p_Var2 = *(_List_node_base **)(this + 0x18);
    p_Var3 = (_List_node_base *)operator_new(0x20);
    p_Var3[1]._M_next = p_Var1;
    p_Var3[1]._M_prev = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    *(long *)(this + 0x50) = *(long *)(this + 0x50) + 1;
    *(undefined8 *)(this + 0x18) = 0;
    *(undefined8 *)(this + 0x20) = 0;
  }
  return;
}

Assistant:

void stash() {
        if (blockPtr) {
            usedBlocks.push_back(std::make_pair(blockPtr, curAllocSize));
            blockPtr = nullptr; curAllocSize = 0;
        }
    }